

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O1

void serialization::unserialize_helper<serialization::json_iarchive,std::__cxx11::string,Person>
               (json_iarchive *ar,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
               *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  size_type i;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person> tmp;
  string local_d8;
  Person local_b8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Person>,std::_Select1st<std::pair<std::__cxx11::string_const,Person>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>
  *local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  local_88;
  const_iterator local_40;
  _Alloc_node local_38;
  
  local_90 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Person>,std::_Select1st<std::pair<std::__cxx11::string_const,Person>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>
              *)v;
  sVar3 = json_iarchive::load_sequence_start(ar);
  if (sVar3 != 0) {
    paVar1 = &local_d8.field_2;
    paVar2 = &local_b8.name.field_2;
    local_40._M_node = (_Base_ptr)(local_90 + 8);
    i = 0;
    do {
      json_iarchive::load_sequence_item_start(ar,i);
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      local_b8.age = 0;
      local_b8._36_4_ = 0;
      local_b8.name.field_2._8_8_ = 0;
      local_b8.name._M_string_length = 0;
      local_b8.name.field_2._M_allocated_capacity = 0;
      local_d8._M_dataplus._M_p = (pointer)paVar1;
      local_b8.name._M_dataplus._M_p = (pointer)paVar2;
      json_iarchive::load_object_start(ar);
      json_iarchive::load_key_start(ar,"first");
      json_iarchive::load(ar,&local_d8);
      json_iarchive::load_key_end(ar,"first");
      json_iarchive::load_key_start(ar,"second");
      json_iarchive::load_object_start(ar);
      Person::unserialize_impl<serialization::json_iarchive>(&local_b8,ar);
      json_iarchive::load_key_end(ar,"second");
      local_88.first._M_dataplus._M_p = (pointer)&local_88.first.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == paVar1) {
        local_88.first.field_2._8_8_ = local_d8.field_2._8_8_;
      }
      else {
        local_88.first._M_dataplus._M_p = local_d8._M_dataplus._M_p;
      }
      local_88.first.field_2._M_allocated_capacity._1_7_ =
           local_d8.field_2._M_allocated_capacity._1_7_;
      local_88.first.field_2._M_local_buf[0] = local_d8.field_2._M_local_buf[0];
      local_88.second.name._M_dataplus._M_p = (pointer)&local_88.second.name.field_2;
      local_88.first._M_string_length = local_d8._M_string_length;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.name._M_dataplus._M_p == paVar2) {
        local_88.second.name.field_2._8_8_ = local_b8.name.field_2._8_8_;
      }
      else {
        local_88.second.name._M_dataplus._M_p = local_b8.name._M_dataplus._M_p;
      }
      local_88.second.name.field_2._M_allocated_capacity =
           local_b8.name.field_2._M_allocated_capacity;
      local_88.second.name._M_string_length = local_b8.name._M_string_length;
      local_b8.name._M_string_length = 0;
      local_b8.name.field_2._M_allocated_capacity =
           local_b8.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_88.second.age = local_b8.age;
      local_38._M_t =
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
            *)local_90;
      local_d8._M_dataplus._M_p = (pointer)paVar1;
      local_b8.name._M_dataplus._M_p = (pointer)paVar2;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Person>,std::_Select1st<std::pair<std::__cxx11::string_const,Person>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>
      ::
      _M_insert_unique_<std::pair<std::__cxx11::string_const,Person>,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Person>,std::_Select1st<std::pair<std::__cxx11::string_const,Person>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>::_Alloc_node>
                (local_90,local_40,&local_88,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.second.name._M_dataplus._M_p != &local_88.second.name.field_2) {
        operator_delete(local_88.second.name._M_dataplus._M_p,
                        local_88.second.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.first._M_dataplus._M_p != &local_88.first.field_2) {
        operator_delete(local_88.first._M_dataplus._M_p,
                        local_88.first.field_2._M_allocated_capacity + 1);
      }
      json_iarchive::load_sequence_item_end(ar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.name._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8.name._M_dataplus._M_p,
                        local_b8.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,
                        CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                 local_d8.field_2._M_local_buf[0]) + 1);
      }
      i = i + 1;
    } while (sVar3 != i);
  }
  return;
}

Assistant:

inline void unserialize_helper(const Archive & ar, std::map<Key, Value> & v)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto size = ar.load_sequence_start();
    for(size_type i = 0; i < size; ++i)
    {
        ar.load_sequence_item_start(i);
        typename std::pair<Key, Value> tmp;
        unserialize_helper(ar, tmp);
        *std::insert_iterator<std::map<Key, Value>>(v, v.end()) = std::move(tmp);
        ar.load_sequence_item_end();
    }
    ar.load_sequence_end();
}